

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O0

void __thiscall
btSliderConstraint::btSliderConstraint
          (btSliderConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btTransform *frameInA,
          btTransform *frameInB,bool useLinearReferenceFrameA)

{
  btSliderConstraint *this_00;
  undefined8 *in_RDI;
  byte in_R9B;
  btRigidBody *in_stack_ffffffffffffff88;
  btSliderConstraint *pbVar1;
  btRigidBody *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  btTypedConstraint *in_stack_ffffffffffffffa0;
  undefined8 *local_50;
  
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffffa0,
             (btTypedConstraintType)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *in_RDI = &PTR__btSliderConstraint_002e75d0;
  *(undefined1 *)(in_RDI + 9) = 0;
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff90,(btTransform *)in_stack_ffffffffffffff88);
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff90,(btTransform *)in_stack_ffffffffffffff88);
  *(byte *)((long)in_RDI + 0xcc) = in_R9B & 1;
  local_50 = in_RDI + 0x29;
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff90);
    local_50 = (undefined8 *)((long)local_50 + 0x54);
  } while (local_50 != (undefined8 *)((long)in_RDI + 0x244));
  pbVar1 = (btSliderConstraint *)(in_RDI + 0x4a);
  this_00 = (btSliderConstraint *)((long)in_RDI + 0x34c);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)this_00);
    pbVar1 = (btSliderConstraint *)((pbVar1->m_frameInA).m_basis.m_el[0].m_floats + 2);
  } while (pbVar1 != this_00);
  btTransform::btTransform((btTransform *)this_00);
  btTransform::btTransform((btTransform *)this_00);
  btVector3::btVector3((btVector3 *)(in_RDI + 0x7a));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x7c));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x7e));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x80));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x82));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x84));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x86));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x88));
  initParams(this_00);
  return;
}

Assistant:

btSliderConstraint::btSliderConstraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB, bool useLinearReferenceFrameA)
        : btTypedConstraint(SLIDER_CONSTRAINT_TYPE, rbA, rbB),
		m_useSolveConstraintObsolete(false),
		m_frameInA(frameInA),
        m_frameInB(frameInB),
		m_useLinearReferenceFrameA(useLinearReferenceFrameA)
{
	initParams();
}